

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O1

int mriStepInnerStepper_HasRequiredOps(MRIStepInnerStepper stepper)

{
  MRIStepInnerStepper_Ops p_Var1;
  int iVar2;
  
  iVar2 = -0x16;
  if (((stepper != (MRIStepInnerStepper)0x0) &&
      (p_Var1 = stepper->ops, p_Var1 != (MRIStepInnerStepper_Ops)0x0)) &&
     ((p_Var1->evolve == (MRIStepInnerEvolveFn)0x0 ||
      (iVar2 = 0, p_Var1->fullrhs == (MRIStepInnerFullRhsFn)0x0)))) {
    return -0x16;
  }
  return iVar2;
}

Assistant:

int mriStepInnerStepper_HasRequiredOps(MRIStepInnerStepper stepper)
{
  if (stepper == NULL) return ARK_ILL_INPUT;
  if (stepper->ops == NULL) return ARK_ILL_INPUT;

  if (stepper->ops->evolve && stepper->ops->fullrhs)
    return ARK_SUCCESS;
  else
    return ARK_ILL_INPUT;
}